

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall
argstest::Positional<int,_argstest::ValueReader>::ParseValue
          (Positional<int,_argstest::ValueReader> *this,string *value_)

{
  type_conflict2 tVar1;
  
  tVar1 = ValueReader::operator()
                    ((ValueReader *)&this->field_0xcc,
                     &(this->super_PositionalBase).super_NamedBase.name,value_,
                     (int *)&(this->super_PositionalBase).super_NamedBase.field_0xc4);
  if (!tVar1) {
    (this->super_PositionalBase).super_NamedBase.super_Base.error = Parse;
  }
  (this->super_PositionalBase).super_NamedBase.field_0xc1 = 0;
  (this->super_PositionalBase).super_NamedBase.super_Base.matched = true;
  return;
}

Assistant:

virtual void ParseValue(const std::string &value_) override
            {
#ifdef ARGS_NOEXCEPT
                if (!reader(name, value_, this->value))
                {
                    error = Error::Parse;
                }
#else
                reader(name, value_, this->value);
#endif
                ready = false;
                matched = true;
            }